

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *module;
  
  memset(chartab + 0x14,0,0x3ec);
  builtin_memcpy(chartab,"  chartab\n",0xb);
  chartab[0xb] = '\0';
  chartab[0xc] = '\0';
  chartab[0xd] = '\0';
  chartab[0xe] = '\0';
  chartab[0xf] = '\0';
  chartab[0x10] = '\0';
  chartab[0x11] = '\0';
  chartab[0x12] = '\0';
  chartab[0x13] = '\0';
  memset(inttab,0,0x1000);
  memset(longtab,0,0x2000);
  xmlInitParser();
  xmlInitializeCatalog();
  xmlRelaxNGInitTypes();
  xmlCheckVersion(0x5398);
  xmlSetStructuredErrorFunc(0,structured_errors);
  xmlSetExternalEntityLoader(xmlNoNetExternalEntityLoader);
  if (argc < 2) {
LAB_001171cb:
    iVar1 = testlibxml2();
  }
  else {
    module = argv[1];
    if (((*module == '-') && (module[1] == 'q')) && (module[2] == '\0')) {
      quiet = 1;
      if (argc == 2) goto LAB_001171cb;
      module = argv[2];
    }
    iVar1 = test_module(module);
  }
  xmlCleanupParser();
  uVar2 = xmlMemBlocks();
  uVar3 = xmlMemUsed();
  if (uVar2 != 0 || uVar3 != 0) {
    printf("testapi leaked %d bytes in %d blocks\n",(ulong)uVar3,(ulong)uVar2);
    iVar1 = 1;
  }
  return (int)(iVar1 != 0);
}

Assistant:

int main(int argc, char **argv) {
    int ret;
    int blocks, mem;

#if defined(_WIN32)
    setvbuf(stdout, NULL, _IONBF, 0);
    setvbuf(stderr, NULL, _IONBF, 0);

    printf("Skipping on Windows for now\n");
    return(0);
#endif

    memset(chartab, 0, sizeof(chartab));
    strncpy((char *) chartab, "  chartab\n", 20);
    memset(inttab, 0, sizeof(inttab));
    memset(longtab, 0, sizeof(longtab));

    xmlInitParser();
#ifdef LIBXML_CATALOG_ENABLED
    xmlInitializeCatalog();
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
    xmlRelaxNGInitTypes();
#endif

    LIBXML_TEST_VERSION

    xmlSetStructuredErrorFunc(NULL, structured_errors);
    xmlSetExternalEntityLoader(xmlNoNetExternalEntityLoader);

    if (argc >= 2) {
        if (!strcmp(argv[1], "-q")) {
	    quiet = 1;
	    if (argc >= 3)
	        ret = test_module(argv[2]);
	    else
		ret = testlibxml2();
        } else {
	   ret = test_module(argv[1]);
	}
    } else
	ret = testlibxml2();

    xmlCleanupParser();
    blocks = xmlMemBlocks();
    mem = xmlMemUsed();
    if ((blocks != 0) || (mem != 0)) {
        printf("testapi leaked %d bytes in %d blocks\n", mem, blocks);
        ret = 1;
    }

    return (ret != 0);
}